

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

void __thiscall ON_String::TrimLeft(ON_String *this,char *s)

{
  int *piVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  ON_Internal_Empty_aString *pOVar5;
  char *pcVar6;
  ulong uVar7;
  
  pcVar4 = this->m_s;
  pOVar5 = (ON_Internal_Empty_aString *)(pcVar4 + -0xc);
  if (pcVar4 == (char *)0x0) {
    pOVar5 = &empty_astring;
  }
  if (0 < (pOVar5->header).string_length) {
    if (s == (char *)0x0) {
      uVar7 = 0xffffffffffffffff;
      do {
        lVar3 = uVar7 + 1;
        uVar7 = uVar7 + 1;
        if (pcVar4[lVar3] < '\x01') break;
      } while (0x5d < (byte)(pcVar4[lVar3] - 0x21U));
    }
    else {
      for (uVar7 = 0; pcVar6 = s, pcVar4[uVar7] != '\0'; uVar7 = uVar7 + 1) {
        do {
          cVar2 = *pcVar6;
          if (cVar2 == '\0') break;
          pcVar6 = pcVar6 + 1;
        } while (cVar2 != pcVar4[uVar7]);
        if (cVar2 == '\0') break;
      }
    }
    if ((int)uVar7 != 0) {
      if (pcVar4[uVar7 & 0xffffffff] == '\0') {
        Destroy(this);
        return;
      }
      CopyArray(this);
      pcVar4 = this->m_s;
      do {
        cVar2 = pcVar4[uVar7 & 0xffffffff];
        *pcVar4 = cVar2;
        pcVar4 = pcVar4 + 1;
      } while (cVar2 != '\0');
      pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar5 = &empty_astring;
      }
      piVar1 = &(pOVar5->header).string_length;
      *piVar1 = *piVar1 - (int)uVar7;
    }
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}